

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O3

void selectrows(void)

{
  float *pfVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int status;
  fitsfile *infptr;
  fitsfile *outfptr;
  int nkeys;
  int hdutype;
  int colnum;
  long naxes [2];
  long noutrows;
  float nullval;
  int anynulls;
  int nfound;
  int keypos;
  char outfilename [13];
  float density [6];
  char infilename [13];
  char card [81];
  
  builtin_strncpy(infilename + 8,".fit",5);
  builtin_strncpy(infilename,"atestfil",8);
  builtin_strncpy(outfilename + 8,".fit",5);
  builtin_strncpy(outfilename,"btestfil",8);
  status = 0;
  iVar2 = ffopentest(10,&infptr,infilename,0);
  if ((iVar2 != 0) || (iVar2 = ffopentest(10,&outfptr,outfilename,1,&status), iVar2 != 0)) {
    printerror(status);
  }
  iVar2 = ffmahd(infptr,3,&hdutype,&status);
  if (iVar2 != 0) {
    printerror(status);
  }
  if (hdutype == 2) {
    iVar2 = ffmahd(outfptr,2,&hdutype,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    iVar2 = ffcrhd(outfptr,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    iVar2 = ffghps(infptr,&nkeys,&keypos,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    if (0 < nkeys) {
      iVar2 = 0;
      do {
        iVar2 = iVar2 + 1;
        ffgrec(infptr,iVar2,card,&status);
        ffprec(outfptr,card,&status);
      } while (iVar2 < nkeys);
    }
    iVar2 = ffgknj(infptr,"NAXIS",1,2,naxes,&nfound,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    iVar2 = ffgcno(infptr,0,"density",&colnum,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    nullval = -99.0;
    iVar2 = ffgcv(infptr,0x2a,colnum,1,1,naxes[1],&nullval,density,&anynulls,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    pvVar3 = malloc(naxes[0]);
    noutrows = 0;
    if (0 < naxes[1]) {
      lVar6 = 0;
      lVar5 = 0;
      lVar4 = naxes[1];
      do {
        pfVar1 = density + lVar6;
        lVar6 = lVar6 + 1;
        if (*pfVar1 <= 3.0 && *pfVar1 != 3.0) {
          lVar5 = lVar5 + 1;
          noutrows = lVar5;
          ffgtbb(infptr,lVar6,1,naxes[0],pvVar3,&status);
          ffptbb(outfptr,lVar5,1,naxes[0],pvVar3,&status);
          lVar4 = naxes[1];
        }
      } while (lVar6 < lVar4);
    }
    iVar2 = ffuky(outfptr,0x29,"NAXIS2",&noutrows,0,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    iVar2 = ffclos(outfptr,&status);
    if ((iVar2 == 0) && (iVar2 = ffclos(infptr,&status), iVar2 == 0)) {
      return;
    }
    printerror(status);
  }
  else {
    puts("Error: expected to find a binary table in this HDU");
  }
  return;
}

Assistant:

void selectrows( void )

    /*********************************************************************/
    /* select rows from an input table and copy them to the output table */
    /*********************************************************************/
{
    fitsfile *infptr, *outfptr;  /* pointer to input and output FITS files */
    unsigned char *buffer;
    char card[FLEN_CARD];
    int status, hdutype, nkeys, keypos, nfound, colnum, anynulls, ii;
    long naxes[2], frow, felem, noutrows, irow;
    float nullval, density[6];

    char infilename[]  = "atestfil.fit";  /* name for existing FITS file   */
    char outfilename[] = "btestfil.fit";  /* name for new FITS file        */

    status = 0;

    /* open the existing FITS files */
    if ( fits_open_file(&infptr,  infilename,  READONLY,  &status) ||
         fits_open_file(&outfptr, outfilename, READWRITE, &status) ) 
         printerror( status );

    /* move to the 3rd HDU in the input file (a binary table in this case) */
    if ( fits_movabs_hdu(infptr, 3, &hdutype, &status) )
         printerror( status );

    if (hdutype != BINARY_TBL)  {
        printf("Error: expected to find a binary table in this HDU\n");
        return;
    }
    /* move to the last (2rd) HDU in the output file */
    if ( fits_movabs_hdu(outfptr, 2, &hdutype, &status) )
         printerror( status );

    /* create new extension in the output file */
    if ( fits_create_hdu(outfptr, &status) )
         printerror( status );

    /* get number of keywords */
    if ( fits_get_hdrpos(infptr, &nkeys, &keypos, &status) ) 
         printerror( status );

    /* copy all the keywords from the input to the output extension */
    for (ii = 1; ii <= nkeys; ii++)  {
        fits_read_record (infptr, ii, card, &status); 
        fits_write_record(outfptr,    card, &status); 
    }

    /* read the NAXIS1 and NAXIS2 keyword to get table size */
    if (fits_read_keys_lng(infptr, "NAXIS", 1, 2, naxes, &nfound, &status) )
         printerror( status );

    /* find which column contains the DENSITY values */
    if ( fits_get_colnum(infptr, CASEINSEN, "density", &colnum, &status) )
         printerror( status );

    /* read the DENSITY column values */
    frow = 1;
    felem = 1;
    nullval = -99.;
    if (fits_read_col(infptr, TFLOAT, colnum, frow, felem, naxes[1], 
        &nullval, density, &anynulls, &status) )
        printerror( status );

    /* allocate buffer large enough for 1 row of the table */
    buffer = (unsigned char *) malloc(naxes[0]);

    /* If the density is less than 3.0, copy the row to the output table */
    for (noutrows = 0, irow = 1; irow <= naxes[1]; irow++)  {
      if (density[irow - 1] < 3.0)  {
        noutrows++;
        fits_read_tblbytes( infptr, irow,      1, naxes[0], buffer, &status); 
        fits_write_tblbytes(outfptr, noutrows, 1, naxes[0], buffer, &status); 
    } }

    /* update the NAXIS2 keyword with the correct number of rows */
    if ( fits_update_key(outfptr, TLONG, "NAXIS2", &noutrows, 0, &status) )
         printerror( status );

    if (fits_close_file(outfptr, &status) || fits_close_file(infptr, &status))
        printerror( status );

    return;
}